

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O0

TestStatus * __thiscall
vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorPool::Parameters>::iterate
          (TestStatus *__return_storage_ptr__,
          FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorPool::Parameters> *this)

{
  Context *pCVar1;
  Function p_Var2;
  Parameters in_stack_ffffffffffffff88;
  Parameters local_38;
  FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorPool::Parameters> *local_18;
  FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorPool::Parameters> *this_local;
  
  pCVar1 = (this->super_TestInstance).m_context;
  p_Var2 = (this->m_args).func;
  local_18 = this;
  this_local = (FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorPool::Parameters> *)
               __return_storage_ptr__;
  api::anon_unknown_1::DescriptorPool::Parameters::Parameters(&local_38,&(this->m_args).arg0);
  (*p_Var2)(__return_storage_ptr__,pCVar1,in_stack_ffffffffffffff88);
  api::anon_unknown_1::DescriptorPool::Parameters::~Parameters(&local_38);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	iterate				(void) { return m_args.func(m_context, m_args.arg0); }